

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbFunc.c
# Opt level: O2

Cnf_Dat_t * Acb_NtkDeriveMiterCnf(Gia_Man_t *p,int iTar,int nTars,int fVerbose)

{
  Gia_Man_t *p_00;
  Gia_Man_t *pGVar1;
  Cnf_Dat_t *pCVar2;
  int iVar3;
  int iVar4;
  bool bVar5;
  
  p_00 = Gia_ManDup(p);
  iVar3 = 0;
  if (0 < iTar) {
    iVar3 = iTar;
  }
  iVar4 = -nTars;
  while( true ) {
    bVar5 = iVar3 == 0;
    iVar3 = iVar3 + -1;
    if (bVar5) {
      if (fVerbose != 0) {
        printf("M_quo: ");
        Gia_ManPrintStats(p_00,(Gps_Par_t *)0x0);
        printf("M_syn: ");
        Gia_ManPrintStats(p_00,(Gps_Par_t *)0x0);
      }
      pCVar2 = (Cnf_Dat_t *)Mf_ManGenerateCnf(p_00,8,0,0,0,0);
      Gia_ManStop(p_00);
      return pCVar2;
    }
    pGVar1 = Gia_ManDupUniv(p_00,p_00->vCis->nSize + iVar4);
    if (pGVar1->vCis->nSize != p_00->vCis->nSize) break;
    Gia_ManStop(p_00);
    iVar4 = iVar4 + 1;
    p_00 = pGVar1;
  }
  __assert_fail("Gia_ManCiNum(pCof) == Gia_ManCiNum(p)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acbFunc.c"
                ,0x7fb,"Cnf_Dat_t *Acb_NtkDeriveMiterCnf(Gia_Man_t *, int, int, int)");
}

Assistant:

Cnf_Dat_t * Acb_NtkDeriveMiterCnf( Gia_Man_t * p, int iTar, int nTars, int fVerbose )
{
    Gia_Man_t * pCof = Gia_ManDup( p );
    Cnf_Dat_t * pCnf; int v;
    for ( v = 0; v < iTar; v++ )
    {
        pCof = Gia_ManDupUniv( p = pCof, Gia_ManCiNum(pCof) - nTars + v );
        assert( Gia_ManCiNum(pCof) == Gia_ManCiNum(p) );
        Gia_ManStop( p );
    }
    if ( fVerbose ) printf( "M_quo: " );
    if ( fVerbose ) Gia_ManPrintStats( pCof, NULL );
    //pCof = Acb_NtkEcoSynthesize( p = pCof );
    //Gia_ManStop( p );
    if ( fVerbose ) printf( "M_syn: " );
    if ( fVerbose ) Gia_ManPrintStats( pCof, NULL );
    if ( 0 && iTar < nTars )
    {
        Gia_Man_t * pCof0 = Gia_ManDupCofactorVar( pCof, Gia_ManCiNum(pCof) - nTars + iTar, 0 );
        Gia_Man_t * pCof1 = Gia_ManDupCofactorVar( pCof, Gia_ManCiNum(pCof) - nTars + iTar, 1 );
        pCof0 = Acb_NtkEcoSynthesize( p = pCof0 );
        Gia_ManStop( p );
        pCof1 = Acb_NtkEcoSynthesize( p = pCof1 );
        Gia_ManStop( p );
        Gia_AigerWrite( pCof0, "eco_qbf0.aig", 0, 0, 0 );
        Gia_AigerWrite( pCof1, "eco_qbf1.aig", 0, 0, 0 );
        Gia_ManStop( pCof0 );
        Gia_ManStop( pCof1 );
        printf( "Dumped cof0 into file \"%s\".\n", "eco_qbf0.aig" );
        printf( "Dumped cof1 into file \"%s\".\n", "eco_qbf1.aig" );
    }
//    Gia_AigerWrite( pCof, "eco_qbf.aig", 0, 0, 0 );
//    printf( "Dumped the result of quantification into file \"%s\".\n", "eco_qbf.aig" );
    pCnf = (Cnf_Dat_t *)Mf_ManGenerateCnf( pCof, 8, 0, 0, 0, 0 );
    Gia_ManStop( pCof );
    return pCnf;
}